

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

uint __thiscall
embree::TutorialScene::materialID
          (TutorialScene *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  size_type sVar1;
  value_type *in_RSI;
  vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
  *in_RDI;
  
  if ((in_RSI->ptr->super_Node).id == 0xffffffff) {
    std::
    vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
    ::push_back(in_RDI,in_RSI);
    sVar1 = std::
            vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
            ::size(in_RDI + 1);
    (in_RSI->ptr->super_Node).id = (int)sVar1 - 1;
  }
  return (in_RSI->ptr->super_Node).id;
}

Assistant:

unsigned TutorialScene::materialID(Ref<SceneGraph::MaterialNode> material) 
  {
    if (material->id == -1) {
      materials.push_back(material);
      material->id = unsigned(materials.size()-1);
    }
    return material->id;
  }